

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O1

char * srcdir_path(char *file)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  pcVar2 = getenv("srcdir");
  uVar5 = (ulong)(uint)srcdir_path::curpath;
  if (file == (char *)0x0) {
    if (0 < srcdir_path::curpath) {
      pcVar2 = srcdir_path::filepath[uVar5];
      do {
        free(pcVar2);
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 != 0);
    }
    srcdir_path::curpath = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    if (0x1f < srcdir_path::curpath) {
      srcdir_path_cold_1();
    }
    if (0x1f < srcdir_path::curpath) {
      __assert_fail("curpath < NUMPATHS",
                    "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/tests/session_fixture.c"
                    ,0x104,"char *srcdir_path(const char *)");
    }
    if (pcVar2 == (char *)0x0) {
      iVar1 = snprintf((char *)0x0,0,"%s",file);
      if (iVar1 < 1) {
        return (char *)0x0;
      }
      pcVar2 = (char *)calloc(1,(ulong)(iVar1 + 1));
      srcdir_path::filepath[srcdir_path::curpath] = pcVar2;
      snprintf(pcVar2,(ulong)(iVar1 + 1),"%s",file);
    }
    else {
      iVar1 = snprintf((char *)0x0,0,"%s/%s",pcVar2,file);
      if (iVar1 < 3) {
        return (char *)0x0;
      }
      __s = (char *)calloc(1,(ulong)(iVar1 + 1));
      srcdir_path::filepath[srcdir_path::curpath] = __s;
      snprintf(__s,(ulong)(iVar1 + 1),"%s/%s",pcVar2,file);
    }
    lVar3 = (long)srcdir_path::curpath;
    srcdir_path::curpath = srcdir_path::curpath + 1;
    pcVar2 = srcdir_path::filepath[lVar3];
  }
  return pcVar2;
}

Assistant:

char *srcdir_path(const char *file)
{
    static char *filepath[NUMPATHS];
    static int curpath;
    char *p = getenv("srcdir");
    if(file) {
        int len;
        if(curpath >= NUMPATHS) {
            fprintf(stderr, "srcdir_path ran out of filepath slots.\n");
        }
        assert(curpath < NUMPATHS);
        if(p) {
            len = snprintf(NULL, 0, "%s/%s", p, file);
            if(len > 2) {
                filepath[curpath] = calloc(1, (size_t)len + 1);
                snprintf(filepath[curpath], (size_t)len + 1, "%s/%s", p, file);
            }
            else {
               return NULL;
            }
        }
        else {
            len = snprintf(NULL, 0, "%s", file);
            if(len > 0) {
                filepath[curpath] = calloc(1, (size_t)len + 1);
                snprintf(filepath[curpath], (size_t)len + 1, "%s", file);
            }
            else {
               return NULL;
            }
        }
        return filepath[curpath++];
    }
    else {
        int i;
        for(i = 0; i < curpath; ++i) {
            free(filepath[curpath]);
        }
        curpath = 0;
        return NULL;
    }
}